

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int luv_fs_read(lua_State *L)

{
  int *piVar1;
  int iVar2;
  lua_Integer lVar3;
  size_t __size;
  char *pcVar4;
  uv_fs_t *req_00;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  uv_fs_cb cb;
  char *pcVar6;
  bool bVar7;
  uv_buf_t uVar8;
  int nargs;
  luv_req_t *data_1;
  int sync;
  int ret;
  char *local_60;
  char *data;
  uv_fs_t *req;
  undefined1 auStack_40 [4];
  int ref;
  uv_buf_t buf;
  int64_t offset;
  int64_t len;
  uv_file file;
  lua_State *L_local;
  
  lVar3 = luaL_checkinteger(L,1);
  __size = luaL_checkinteger(L,2);
  buf.len = luaL_checkinteger(L,3);
  pcVar4 = (char *)malloc(__size);
  if (pcVar4 == (char *)0x0) {
    L_local._4_4_ = luaL_error(L,"Failure to allocate buffer");
  }
  else {
    uVar8 = uv_buf_init(pcVar4,(uint)__size);
    _sync = uVar8.base;
    _auStack_40 = _sync;
    local_60 = (char *)uVar8.len;
    buf.base = local_60;
    iVar2 = luv_check_continuation(L,4);
    req_00 = (uv_fs_t *)lua_newuserdata(L,0x1b8);
    plVar5 = luv_setup_req(L,iVar2);
    req_00->data = plVar5;
    *(char **)((long)req_00->data + 0x10) = _auStack_40;
    piVar1 = (int *)req_00->data;
    bVar7 = piVar1[1] == -2;
    loop = luv_loop(L);
    cb = luv_fs_cb;
    if (bVar7) {
      cb = (uv_fs_cb)0x0;
    }
    iVar2 = uv_fs_read(loop,req_00,(uv_file)lVar3,(uv_buf_t *)auStack_40,1,buf.len,cb);
    if ((req_00->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
      if (bVar7) {
        L_local._4_4_ = push_fs_result(L,req_00);
        if (req_00->fs_type != UV_FS_SCANDIR) {
          luv_cleanup_req(L,(luv_req_t *)req_00->data);
          req_00->data = (void *)0x0;
          uv_fs_req_cleanup(req_00);
        }
      }
      else {
        lua_rawgeti(L,-0xf4628,(long)*piVar1);
        L_local._4_4_ = 1;
      }
    }
    else {
      lua_pushnil(L);
      if (req_00->path == (char *)0x0) {
        pcVar4 = uv_err_name((int)req_00->result);
        pcVar6 = uv_strerror((int)req_00->result);
        lua_pushfstring(L,"%s: %s",pcVar4,pcVar6);
      }
      else {
        pcVar4 = uv_err_name((int)req_00->result);
        pcVar6 = uv_strerror((int)req_00->result);
        lua_pushfstring(L,"%s: %s: %s",pcVar4,pcVar6,req_00->path);
      }
      pcVar4 = uv_err_name((int)req_00->result);
      lua_pushstring(L,pcVar4);
      luv_cleanup_req(L,(luv_req_t *)req_00->data);
      req_00->data = (void *)0x0;
      uv_fs_req_cleanup(req_00);
      L_local._4_4_ = 3;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int luv_fs_read(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_file file = luaL_checkinteger(L, 1);
  int64_t len = luaL_checkinteger(L, 2);
  int64_t offset = luaL_checkinteger(L, 3);
  uv_buf_t buf;
  int ref;
  uv_fs_t* req;
  char* data = (char*)malloc(len);
  if (!data) return luaL_error(L, "Failure to allocate buffer");
  buf = uv_buf_init(data, len);
  ref = luv_check_continuation(L, 4);
  req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  // TODO: find out why we can't just use req->ptr for the base
  ((luv_req_t*)req->data)->data = buf.base;
  FS_CALL(read, req, file, &buf, 1, offset);
}